

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O1

void __thiscall beast::unit_test::runner::log<void>(runner *this,string *s)

{
  int iVar1;
  string local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    if (this->default_ == true) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
      testcase<void>(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    (*this->_vptr_runner[8])(this,s);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void
runner::log(std::string const& s)
{
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if(default_)
        testcase("");
    on_log(s);
}